

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSingleLumpFont::LoadFON1(FSingleLumpFont *this,int lump,BYTE *data)

{
  undefined4 uVar1;
  CharData *pCVar2;
  BYTE *pBVar3;
  long lVar4;
  ulong uVar5;
  
  pCVar2 = (CharData *)operator_new__(0x1000);
  (this->super_FFont).Chars = pCVar2;
  uVar1 = *(undefined4 *)(data + 4);
  lVar4 = 0;
  this->FontType = FONT1;
  uVar5 = (ulong)(CONCAT24((short)((uint)uVar1 >> 0x10),uVar1) & 0xffff0000ffff);
  (this->super_FFont).SpaceWidth = (int)uVar5;
  (this->super_FFont).FontHeight = (int)(uVar5 >> 0x20);
  (this->super_FFont).FirstChar = 0;
  (this->super_FFont).LastChar = 0xff;
  (this->super_FFont).GlobalKerning = 0;
  pBVar3 = (BYTE *)operator_new__(0x100);
  (this->super_FFont).PatchRemap = pBVar3;
  do {
    *(undefined8 *)((long)&pCVar2->Pic + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x1000);
  (*(this->super_FFont)._vptr_FFont[4])(this);
  return;
}

Assistant:

void FSingleLumpFont::LoadFON1 (int lump, const BYTE *data)
{
	int w, h;

	Chars = new CharData[256];

	w = data[4] + data[5]*256;
	h = data[6] + data[7]*256;

	FontType = FONT1;
	FontHeight = h;
	SpaceWidth = w;
	FirstChar = 0;
	LastChar = 255;
	GlobalKerning = 0;
	PatchRemap = new BYTE[256];

	for(unsigned int i = 0;i < 256;++i)
		Chars[i].Pic = NULL;

	LoadTranslations();
}